

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

void __thiscall Gecko::Graph::reweight(Graph *this,uint k)

{
  Functional *pFVar1;
  pointer pNVar2;
  Index IVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  
  std::vector<float,_std::allocator<float>_>::resize
            (&this->bond,
             (long)(this->weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,0.0);
  if (4 < (ulong)((long)(this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start)) {
    uVar5 = 1;
    uVar4 = 2;
    do {
      pFVar1 = this->functional;
      fVar6 = (this->weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      IVar3 = arc_source(this,uVar4 - 1);
      pNVar2 = (this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar6 = (float)(**(code **)(*(long *)pFVar1 + 0x48))
                               (fVar6,ABS(pNVar2[IVar3].pos -
                                          pNVar2[(this->adj).
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar5]].
                                          pos),pFVar1,k);
      (this->bond).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start[uVar5] = fVar6;
      uVar5 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)((long)(this->adj).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->adj).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  return;
}

Assistant:

void
Graph::reweight(uint k)
{
  bond.resize(weight.size());
  for (Arc::Index a = 1; a < adj.size(); a++)
    bond[a] = functional->bond(weight[a], length(a), k);
}